

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O0

bool tcu::bilinearCompare
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask,RGBA threshold)

{
  bool bVar1;
  TextureFormat *this;
  InternalError *this_00;
  allocator<char> local_59;
  string local_58;
  deUint32 local_34;
  TextureFormat local_30;
  PixelBufferAccess *local_28;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  RGBA threshold_local;
  
  local_28 = errorMask;
  errorMask_local = (PixelBufferAccess *)result;
  result_local = reference;
  reference_local._4_4_ = threshold.m_value;
  this = ConstPixelBufferAccess::getFormat(reference);
  TextureFormat::TextureFormat(&local_30,RGBA,UNORM_INT8);
  bVar1 = TextureFormat::operator==(this,&local_30);
  if (!bVar1) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Unsupported format for bilinear comparison",&local_59);
    InternalError::InternalError(this_00,&local_58);
    __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
  }
  local_34 = reference_local._4_4_;
  bVar1 = anon_unknown_0::bilinearCompareRGBA8
                    (result_local,&errorMask_local->super_ConstPixelBufferAccess,local_28,
                     reference_local._4_4_);
  return bVar1;
}

Assistant:

bool bilinearCompare (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const PixelBufferAccess& errorMask, const RGBA threshold)
{
	DE_ASSERT(reference.getWidth()	== result.getWidth()	&&
			  reference.getHeight()	== result.getHeight()	&&
			  reference.getDepth()	== result.getDepth()	&&
			  reference.getFormat()	== result.getFormat());
	DE_ASSERT(reference.getWidth()	== errorMask.getWidth()		&&
			  reference.getHeight()	== errorMask.getHeight()	&&
			  reference.getDepth()	== errorMask.getDepth());

	if (reference.getFormat() == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
		return bilinearCompareRGBA8(reference, result, errorMask, threshold);
	else
		throw InternalError("Unsupported format for bilinear comparison");
}